

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

result_type __thiscall
WellTestCase<Well<unsigned_int,_32UL,_19UL,_1UL,_16UL,_18UL,_13UL,_Detail::M3<-18>,_Detail::M3<-14>,_Detail::M0,_Detail::M3<18>,_Detail::M3<-24>,_Detail::M3<5>,_Detail::M3<-1>,_Detail::M0,_Detail::NoTempering>,_2933843930U>
::generate(WellTestCase<Well<unsigned_int,_32UL,_19UL,_1UL,_16UL,_18UL,_13UL,_Detail::M3<_18>,_Detail::M3<_14>,_Detail::M0,_Detail::M3<18>,_Detail::M3<_24>,_Detail::M3<5>,_Detail::M3<_1>,_Detail::M0,_Detail::NoTempering>,_2933843930U>
           *this)

{
  result_type rVar1;
  long lVar2;
  uint uVar3;
  uint *p;
  uint state [19];
  uint *local_70;
  uint local_68 [19];
  uint local_1c [3];
  
  lVar2 = 0;
  do {
    *(undefined4 *)((long)local_68 + lVar2) = 1;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x4c);
  local_70 = local_68;
  Well<unsigned_int,32ul,19ul,1ul,16ul,18ul,13ul,Detail::M3<-18>,Detail::M3<-14>,Detail::M0,Detail::M3<18>,Detail::M3<-24>,Detail::M3<5>,Detail::M3<-1>,Detail::M0,Detail::NoTempering>
  ::seed<unsigned_int*>
            ((Well<unsigned_int,32ul,19ul,1ul,16ul,18ul,13ul,Detail::M3<_18>,Detail::M3<_14>,Detail::M0,Detail::M3<18>,Detail::M3<_24>,Detail::M3<5>,Detail::M3<_1>,Detail::M0,Detail::NoTempering>
              *)this,&local_70,local_1c);
  uVar3 = 0x3b9aca01;
  do {
    rVar1 = Well<unsigned_int,_32UL,_19UL,_1UL,_16UL,_18UL,_13UL,_Detail::M3<-18>,_Detail::M3<-14>,_Detail::M0,_Detail::M3<18>,_Detail::M3<-24>,_Detail::M3<5>,_Detail::M3<-1>,_Detail::M0,_Detail::NoTempering>
            ::operator()(&this->rng);
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  return rVar1;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, RandomNumberGenerator::state_size, 1);

        unsigned* p = state;
        rng.seed(p, p + RandomNumberGenerator::state_size);

        result_type x = 0;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }